

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bplustree.cpp
# Opt level: O1

void __thiscall
BPlusTree::InsertInternal
          (BPlusTree *this,float key,shared_ptr<Node> *parent,shared_ptr<Node> *child)

{
  pointer *ppsVar1;
  float key_00;
  uint32_t uVar2;
  pointer pfVar3;
  pointer pfVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar5;
  iterator __position;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  element_type *this_03;
  long lVar10;
  element_type *peVar11;
  difference_type __d;
  undefined1 local_158 [8];
  vector<float,_std::allocator<float>_> firstHalfKey;
  vector<float,_std::allocator<float>_> secondHalfKey;
  vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> firstHalfPtr;
  vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> secondHalfPtr;
  vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> tempPtrs;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  undefined1 local_d0 [8];
  shared_ptr<void> internalNode2Ptr;
  shared_ptr<Node> local_a0;
  undefined1 local_90 [8];
  shared_ptr<void> newPointer;
  shared_ptr<void> internalNode1Ptr;
  shared_ptr<Node> newRoot;
  vector<float,_std::allocator<float>_> tempKeys;
  float local_38;
  float local_34;
  float newParentKey;
  float key_local;
  
  local_90 = (undefined1  [8])(child->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  newPointer.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (child->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      newPointer.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      newPointer.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           newPointer.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_M_use_count + 1
      ;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      newPointer.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           newPointer.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_M_use_count + 1
      ;
    }
  }
  peVar11 = (parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pfVar3 = (peVar11->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar4 = (peVar11->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar6 = (long)pfVar4 - (long)pfVar3 >> 2;
  local_34 = key;
  if (uVar6 < this->size) {
    if (pfVar4 == pfVar3) {
      iVar7 = -1;
    }
    else {
      uVar8 = 0xffffffff;
      lVar10 = 0;
      do {
        if (key < pfVar3[lVar10]) {
          iVar7 = (int)lVar10;
          break;
        }
        if (uVar6 - 1 == lVar10) {
          uVar8 = uVar6 & 0xffffffff;
        }
        iVar7 = (int)uVar8;
        lVar10 = lVar10 + 1;
      } while (uVar6 + (uVar6 == 0) != lVar10);
    }
    if (iVar7 != -1) {
      std::vector<float,_std::allocator<float>_>::insert
                (&peVar11->keys,(const_iterator)(pfVar3 + iVar7),&local_34);
      peVar11 = (parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::insert
                (&peVar11->ptrs,
                 (peVar11->ptrs).
                 super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + (long)iVar7 + 1,(value_type *)local_90);
    }
  }
  else {
    this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
    this_02->_M_use_count = 1;
    this_02->_M_weak_count = 1;
    this_02->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010dd00;
    uVar2 = this->size;
    this_02[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    this_02[3]._M_use_count = 0;
    this_02[3]._M_weak_count = 0;
    this_02[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    this_02[2]._M_use_count = 0;
    this_02[2]._M_weak_count = 0;
    this_02[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    this_02[1]._M_use_count = 0;
    this_02[1]._M_weak_count = 0;
    *(undefined1 *)&this_02[4]._vptr__Sp_counted_base = 0;
    *(uint32_t *)((long)&this_02[4]._vptr__Sp_counted_base + 4) = uVar2;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)
               &newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &((parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->keys);
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::vector
              ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
               &secondHalfPtr.
                super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               &((parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->ptrs);
    iVar7 = -1;
    if ((long)tempKeys.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start -
        (long)newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi != 0) {
      lVar10 = (long)tempKeys.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start -
               (long)newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               >> 2;
      lVar9 = 0;
      do {
        if (local_34 <
            *(float *)((long)&(newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar9 * 4)) {
          iVar7 = (int)lVar9;
          break;
        }
        if (lVar10 + -1 == lVar9) {
          iVar7 = (int)lVar10;
          break;
        }
        lVar9 = lVar9 + 1;
      } while (lVar10 + (ulong)(lVar10 == 0) != lVar9);
    }
    if (iVar7 != -1) {
      std::vector<float,_std::allocator<float>_>::insert
                ((vector<float,_std::allocator<float>_> *)
                 &newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (float *)((long)&(newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_vptr__Sp_counted_base + (long)iVar7 * 4),
                 &local_34);
      std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::insert
                ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
                 &secondHalfPtr.
                  super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 secondHalfPtr.
                 super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + (long)iVar7 + 1,
                 (value_type *)local_90);
    }
    uVar6 = ((long)tempKeys.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start -
             (long)newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi >>
            2) + 1U >> 1;
    std::vector<float,std::allocator<float>>::
    vector<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
              ((vector<float,std::allocator<float>> *)local_158,
               (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
               newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
               (float *)((long)&(newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar6 * 4),
               (allocator_type *)
               &firstHalfKey.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<float,std::allocator<float>>::
    vector<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
              ((vector<float,std::allocator<float>> *)
               &firstHalfKey.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (float *)((long)&(newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar6 * 4 + 4),
               (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
               tempKeys.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,
               (allocator_type *)
               &secondHalfKey.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<float,_std::allocator<float>_>::operator=
              (&((parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->keys,
               (vector<float,_std::allocator<float>_> *)local_158);
    std::vector<float,_std::allocator<float>_>::operator=
              ((vector<float,_std::allocator<float>_> *)&this_02[2]._M_use_count,
               (vector<float,_std::allocator<float>_> *)
               &firstHalfKey.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>>::
    vector<__gnu_cxx::__normal_iterator<std::shared_ptr<void>const*,std::vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>>>,void>
              ((vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>> *)
               &secondHalfKey.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (__normal_iterator<const_std::shared_ptr<void>_*,_std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>_>
                )secondHalfPtr.
                 super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,
               secondHalfPtr.
               super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + uVar6 + 1,
               (allocator_type *)
               &firstHalfPtr.
                super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>>::
    vector<__gnu_cxx::__normal_iterator<std::shared_ptr<void>const*,std::vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>>>,void>
              ((vector<std::shared_ptr<void>,std::allocator<std::shared_ptr<void>>> *)
               &firstHalfPtr.
                super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               secondHalfPtr.
               super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + uVar6 + 1,
               (__normal_iterator<const_std::shared_ptr<void>_*,_std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>_>
                )tempPtrs.
                 super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (allocator_type *)
               &newPointer.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::operator=
              (&((parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->ptrs,
               (vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
               &secondHalfKey.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    peVar11 = (element_type *)(this_02 + 1);
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::operator=
              ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)peVar11,
               (vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
               &firstHalfPtr.
                super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    newPointer.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_02->_M_use_count = this_02->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_02->_M_use_count = this_02->_M_use_count + 1;
    }
    key_00 = *(float *)((long)&(newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar6 * 4);
    this->numNodes = this->numNodes + 1;
    peVar5 = (this->root).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_d0 = (undefined1  [8])peVar11;
    internalNode2Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_02;
    local_38 = key_00;
    if ((parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == peVar5) {
      newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)operator_new(0x48);
      ((newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ptrs).
      super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x100000001;
      ((newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ptrs).
      super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR___Sp_counted_ptr_inplace_0010dd00;
      ppsVar1 = &((newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ptrs).
                 super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      uVar2 = this->size;
      (newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->isLeaf = false;
      *(undefined3 *)
       &(newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->field_0x31 = 0;
      (newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->size = 0;
      newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].ptrs.
      super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ((newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->keys).
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      ((newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->keys).
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ((newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ptrs).
      super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ((newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->keys).
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      *(undefined1 *)
       &newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].ptrs.
        super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>._M_impl.
        super__Vector_impl_data._M_finish = 0;
      *(uint32_t *)
       ((long)&newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].ptrs.
               super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
               _M_impl.super__Vector_impl_data._M_finish + 4) = uVar2;
      this->numNodes = this->numNodes + 1;
      __position._M_current =
           *(float **)&(newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->isLeaf
      ;
      if ((pointer)__position._M_current ==
          newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].ptrs.
          super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>._M_impl
          .super__Vector_impl_data._M_start) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)
                   &((newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->keys).
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,__position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        *(float **)&(newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->isLeaf =
             __position._M_current + 1;
      }
      std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::push_back
                ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)ppsVar1,
                 (value_type *)
                 &newPointer.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::push_back
                ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)ppsVar1,
                 (value_type *)local_d0);
      (this->root).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)ppsVar1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->root).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&newRoot);
      this_03 = newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    else {
      this_03 = (element_type *)
                (this->root).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (this_03 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ppsVar1 = &(this_03->ptrs).
                     super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *(int *)ppsVar1 = *(int *)ppsVar1 + 1;
          UNLOCK();
        }
        else {
          ppsVar1 = &(this_03->ptrs).
                     super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *(int *)ppsVar1 = *(int *)ppsVar1 + 1;
        }
      }
      this_01 = (parent->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      internalNode2Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar5;
      FindParent((BPlusTree *)
                 &tempPtrs.
                  super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->root,
                 (shared_ptr<Node> *)
                 &internalNode2Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_02->_M_use_count = this_02->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_02->_M_use_count = this_02->_M_use_count + 1;
      }
      local_a0.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar11;
      local_a0.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_02;
      InsertInternal(this,key_00,
                     (shared_ptr<Node> *)
                     &tempPtrs.
                      super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_a0);
      if (local_a0.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a0.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
    }
    if (this_03 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03);
    }
    if (internalNode2Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 internalNode2Ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::~vector
              ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
               &firstHalfPtr.
                super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::~vector
              ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
               &secondHalfKey.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (firstHalfKey.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(firstHalfKey.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    }
    if (local_158 != (undefined1  [8])0x0) {
      operator_delete((void *)local_158);
    }
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::~vector
              ((vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_> *)
               &secondHalfPtr.
                super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      operator_delete(newRoot.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                     );
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  if (newPointer.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               newPointer.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void BPlusTree::InsertInternal(float key, std::shared_ptr<Node> parent, std::shared_ptr<Node> child) {
    std::shared_ptr<void> newPointer(child);

    // parent still have space
    if (parent->keys.size() < size) {
        int insertPos = -1;
        for (int i = 0; i < parent->keys.size(); i++) {
            if (key < parent->keys[i]) {
                insertPos = i;
                break;
            }

            if (i == parent->keys.size()-1) {
                insertPos = parent->keys.size();
            }
        }

        if (insertPos != -1) {
            // insert key in vector
            std::vector<float>::iterator keyInsertItr = parent->keys.begin() + insertPos;
            parent->keys.insert(keyInsertItr, key);

            // insert ptr in vector
            std::vector<std::shared_ptr<void>>::iterator ptrInsertItr = parent->ptrs.begin() + insertPos + 1;
            parent->ptrs.insert(ptrInsertItr, newPointer);
        }
    } else {
        // parent does not have space, split the parent node into 2
        std::shared_ptr<Node> newInternalNode = std::make_shared<Node>(false, size);

        std::vector<float> tempKeys(parent->keys);
        std::vector<std::shared_ptr<void>> tempPtrs(parent->ptrs);

        // insert into temp key & ptr
        int insertPos = -1;
        for (int i = 0; i < tempKeys.size(); i++) {
            if (key < tempKeys[i]) {
                insertPos = i;
                break;
            }

            if (i == tempKeys.size()-1) {
                insertPos = tempKeys.size();
                break;
            }
        }

        if (insertPos != -1) {
            // insert key in vector
            std::vector<float>::iterator keyInsertItr = tempKeys.begin() + insertPos;
            tempKeys.insert(keyInsertItr, key);

            // insert ptr in vector
            std::vector<std::shared_ptr<void>>::iterator ptrInsertItr = tempPtrs.begin() + insertPos + 1;
            tempPtrs.insert(ptrInsertItr, newPointer);
        }

        // split temp key & ptr
        std::size_t splitSize = (tempKeys.size() + 1)/2;
        std::vector<float> firstHalfKey(tempKeys.cbegin(), tempKeys.cbegin() + splitSize);
        std::vector<float> secondHalfKey(tempKeys.cbegin() + splitSize + 1, tempKeys.cend());    // +1 becuase for the second half dont need the first key

        parent->keys = firstHalfKey;
        newInternalNode->keys = secondHalfKey;

        std::vector<std::shared_ptr<void>>::const_iterator splitIter(tempPtrs.cbegin());
        std::advance(splitIter, splitSize);

        std::vector<std::shared_ptr<void>> firstHalfPtr(tempPtrs.cbegin(), splitIter + 1);
        std::vector<std::shared_ptr<void>> secondHalfPtr(splitIter + 1, tempPtrs.cend());

        parent->ptrs = firstHalfPtr;
        newInternalNode->ptrs = secondHalfPtr;

        std::shared_ptr<void> internalNode1Ptr(parent);
        std::shared_ptr<void> internalNode2Ptr(newInternalNode);
        float newParentKey = tempKeys[splitSize];
        numNodes++;

        if (parent == root) {
            std::shared_ptr<Node> newRoot = std::make_shared<Node>(false, size);
            numNodes++;
            newRoot->keys.push_back(newParentKey);
            newRoot->ptrs.push_back(internalNode1Ptr);
            newRoot->ptrs.push_back(internalNode2Ptr);
            root = newRoot;
        } else {
            InsertInternal(newParentKey, FindParent(root, parent), newInternalNode);
        }
    }
}